

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O0

void Gia_ManLutPacking(Gia_Man_t *p,int nBlockSize,int DelayRoute,int DelayDir,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  int *piVar5;
  Vec_Int_t *p_04;
  Vec_Int_t *p_05;
  int Start;
  int Block;
  int DelayMax;
  int Delay;
  int iBlock;
  int nSize;
  int iFan;
  int Id;
  int k;
  int i;
  Vec_Int_t *vBSize;
  Vec_Int_t *vBlock;
  Vec_Int_t *vDelay;
  Vec_Int_t *vOrder;
  Vec_Int_t *vStarts;
  Vec_Int_t *vPacking;
  int Perm [32];
  int Delays [32];
  int fVerbose_local;
  int DelayDir_local;
  int DelayRoute_local;
  int nBlockSize_local;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManLutCollect(p);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_IntStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_02 = Vec_IntStart(iVar1);
  iVar1 = Vec_IntSize(p_00);
  p_03 = Vec_IntAlloc((iVar1 << 1) / nBlockSize);
  Start = 0;
  for (Id = 0; iVar1 = Vec_IntSize(p_00), Id < iVar1; Id = Id + 1) {
    iVar1 = Vec_IntEntry(p_00,Id);
    iVar2 = Gia_ObjLutSize(p,iVar1);
    if (0x20 < iVar2) {
      __assert_fail("nSize <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0x8a,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
    for (iFan = 0; iVar3 = Gia_ObjLutSize(p,iVar1), iFan < iVar3; iFan = iFan + 1) {
      piVar5 = Gia_ObjLutFanins(p,iVar1);
      iVar3 = piVar5[iFan];
      iVar4 = Vec_IntEntry(p_01,iVar3);
      Perm[(long)iFan + 0x1e] = iVar4;
      Perm[(long)iFan + -2] = iVar3;
    }
    Vec_IntSelectSortCost2Reverse((int *)&vPacking,iVar2,Perm + 0x1e);
    if ((1 < iVar2) && (Perm[0x1e] < Perm[(long)(iVar2 + -1) + 0x1e])) {
      __assert_fail("nSize < 2 || Delays[0] >= Delays[nSize-1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0x91,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
    if ((Perm[0x1e] < 0) || (Perm[(long)(iVar2 + -1) + 0x1e] < 0)) {
      __assert_fail("Delays[0] >= 0 && Delays[nSize-1] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0x92,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
    iVar3 = Vec_IntEntry(p_02,(int)vPacking);
    if (((Perm[0x1e] < 1) || (Perm[0x1e] <= Perm[0x1f])) ||
       (iVar4 = Vec_IntEntry(p_03,iVar3), nBlockSize <= iVar4)) {
      Block = Perm[0x1e] + DelayRoute;
      iVar3 = Vec_IntSize(p_03);
      Vec_IntWriteEntry(p_02,iVar1,iVar3);
      Vec_IntPush(p_03,1);
    }
    else {
      Block = Perm[0x1e] + DelayDir;
      Vec_IntWriteEntry(p_02,iVar1,iVar3);
      Vec_IntAddToEntry(p_03,iVar3,1);
    }
    for (iFan = 1; iFan < iVar2; iFan = iFan + 1) {
      Block = Abc_MaxInt(Block,Perm[(long)iFan + 0x1e] + DelayRoute);
    }
    Vec_IntWriteEntry(p_01,iVar1,Block);
    Start = Abc_MaxInt(Start,Block);
  }
  iVar1 = Vec_IntSum(p_03);
  iVar2 = Vec_IntSize(p_00);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSum(vBSize) == Vec_IntSize(vOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                  ,0xa7,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  iVar1 = Vec_IntSize(p_03);
  iVar2 = Vec_IntSize(p_00);
  p_04 = Vec_IntAlloc(iVar1 + iVar2 + 1);
  iVar1 = Vec_IntSize(p_03);
  Vec_IntPush(p_04,iVar1);
  iVar1 = Vec_IntSize(p_03);
  p_05 = Vec_IntAlloc(iVar1);
  for (Id = 0; iVar1 = Vec_IntSize(p_03), Id < iVar1; Id = Id + 1) {
    iVar1 = Vec_IntEntry(p_03,Id);
    Vec_IntPush(p_04,iVar1);
    iVar2 = Vec_IntSize(p_04);
    Vec_IntPush(p_05,iVar2);
    iVar2 = Vec_IntSize(p_04);
    Vec_IntFillExtra(p_04,iVar2 + iVar1,-1);
  }
  iVar1 = Vec_IntCap(p_04);
  if (iVar1 != 0x10) {
    iVar1 = Vec_IntSize(p_04);
    iVar2 = Vec_IntCap(p_04);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_IntCap(vPacking) == 16 || Vec_IntSize(vPacking) == Vec_IntCap(vPacking)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0xb3,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
  }
  Id = Vec_IntSize(p_00);
  while (Id = Id + -1, -1 < Id) {
    iVar1 = Vec_IntEntry(p_00,Id);
    iVar2 = Vec_IntEntry(p_02,iVar1);
    iVar3 = Vec_IntEntry(p_05,iVar2);
    iVar4 = Vec_IntEntry(p_04,iVar3);
    if (iVar4 != -1) {
      __assert_fail("Vec_IntEntry(vPacking, Start) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0xb9,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
    Vec_IntWriteEntry(p_04,iVar3,iVar1);
    Vec_IntAddToEntry(p_05,iVar2,1);
  }
  iVar1 = Vec_IntCountEntry(p_04,-1);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntCountEntry(vPacking, -1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                  ,0xbd,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  Vec_IntFree(p_05);
  Vec_IntFreeP(&p->vPacking);
  p->vPacking = p_04;
  printf("Global delay = %d.\n",(ulong)(uint)Start);
  return;
}

Assistant:

void Gia_ManLutPacking( Gia_Man_t * p, int nBlockSize, int DelayRoute, int DelayDir, int fVerbose )
{
    int Delays[32], Perm[32];
    Vec_Int_t * vPacking, * vStarts;
    Vec_Int_t * vOrder = Gia_ManLutCollect( p );
    Vec_Int_t * vDelay = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vBlock = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vBSize = Vec_IntAlloc( 2 * Vec_IntSize(vOrder) / nBlockSize );
    int i, k, Id, iFan, nSize, iBlock, Delay, DelayMax = 0;
    // create blocks
    Vec_IntForEachEntry( vOrder, Id, i )
    {
        nSize = Gia_ObjLutSize( p, Id );
        assert( nSize <= 32 );
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            Delays[k] = Vec_IntEntry(vDelay, iFan);
            Perm[k] = iFan;
        }
        Vec_IntSelectSortCost2Reverse( Perm, nSize, Delays );
        assert( nSize < 2 || Delays[0] >= Delays[nSize-1] );
        assert( Delays[0] >= 0 && Delays[nSize-1] >= 0 );
        // check if we can reduce delay by adding it to the same bin as the latest one
        iBlock = Vec_IntEntry( vBlock, Perm[0] );
        if ( Delays[0] > 0 && Delays[0] > Delays[1] && Vec_IntEntry(vBSize, iBlock) < nBlockSize )
        {
            Delay = Delays[0] + DelayDir;
            Vec_IntWriteEntry( vBlock, Id, iBlock );
            Vec_IntAddToEntry( vBSize, iBlock, 1 );
        }
        else // clean new block
        {
            Delay = Delays[0] + DelayRoute;
            Vec_IntWriteEntry( vBlock, Id, Vec_IntSize(vBSize) );
            Vec_IntPush( vBSize, 1 );
        }
        // calculate delay
        for ( k = 1; k < nSize; k++ )
            Delay = Abc_MaxInt( Delay, Delays[k] + DelayRoute );
        Vec_IntWriteEntry( vDelay, Id, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    assert( Vec_IntSum(vBSize) == Vec_IntSize(vOrder) );
    // create packing info
    vPacking = Vec_IntAlloc( Vec_IntSize(vBSize) + Vec_IntSize(vOrder) + 1 );
    Vec_IntPush( vPacking, Vec_IntSize(vBSize) );
    // create starting places for each block
    vStarts = Vec_IntAlloc( Vec_IntSize(vBSize) );
    Vec_IntForEachEntry( vBSize, nSize, i )
    {
        Vec_IntPush( vPacking, nSize );
        Vec_IntPush( vStarts, Vec_IntSize(vPacking) );
        Vec_IntFillExtra( vPacking, Vec_IntSize(vPacking) + nSize, -1 );
    }
    assert( Vec_IntCap(vPacking) == 16 || Vec_IntSize(vPacking) == Vec_IntCap(vPacking) );
    // collect LUTs from the block
    Vec_IntForEachEntryReverse( vOrder, Id, i )
    {
        int Block = Vec_IntEntry( vBlock, Id );
        int Start = Vec_IntEntry( vStarts, Block );
        assert( Vec_IntEntry(vPacking, Start) == -1 );
        Vec_IntWriteEntry( vPacking, Start, Id );
        Vec_IntAddToEntry( vStarts, Block, 1 );
    }
    assert( Vec_IntCountEntry(vPacking, -1) == 0 );
    // cleanup
    Vec_IntFree( vOrder );
    Vec_IntFree( vDelay );
    Vec_IntFree( vBlock );
    Vec_IntFree( vBSize );
    Vec_IntFree( vStarts );
    Vec_IntFreeP( &p->vPacking );
    p->vPacking = vPacking;
    printf( "Global delay = %d.\n", DelayMax );
}